

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURL ** curl_multi_get_handles(CURLM *m)

{
  CURL **ppCVar1;
  Curl_llist_node *n;
  void *pvVar2;
  uint uVar3;
  
  ppCVar1 = (CURL **)(*Curl_cmalloc)((ulong)(*(int *)((long)m + 4) + 1) << 3);
  if (ppCVar1 != (CURL **)0x0) {
    n = Curl_llist_head((Curl_llist *)((long)m + 0x30));
    uVar3 = 0;
    for (; n != (Curl_llist_node *)0x0; n = Curl_node_next(n)) {
      pvVar2 = Curl_node_elem(n);
      if ((*(byte *)((long)pvVar2 + 0x13c8) & 0x10) == 0) {
        ppCVar1[uVar3] = pvVar2;
        uVar3 = uVar3 + 1;
      }
    }
    ppCVar1[uVar3] = (CURL *)0x0;
  }
  return ppCVar1;
}

Assistant:

CURL **curl_multi_get_handles(CURLM *m)
{
  struct Curl_multi *multi = m;
  CURL **a = malloc(sizeof(struct Curl_easy *) * (multi->num_easy + 1));
  if(a) {
    unsigned int i = 0;
    struct Curl_llist_node *e;
    for(e = Curl_llist_head(&multi->process); e; e = Curl_node_next(e)) {
      struct Curl_easy *data = Curl_node_elem(e);
      DEBUGASSERT(i < multi->num_easy);
      if(!data->state.internal)
        a[i++] = data;
    }
    a[i] = NULL; /* last entry is a NULL */
  }
  return a;
}